

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void GA_Print_patch(int g_a,int ilo,int ihi,int jlo,int jhi,int pretty)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  Integer hi [2];
  long local_88 [2];
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  
  plVar3 = hi;
  plVar1 = local_88;
  local_88[0] = (long)ilo;
  hi[0] = (long)ihi;
  local_88[1] = (long)jhi;
  for (lVar2 = 1; lVar2 != -1; lVar2 = lVar2 + -1) {
    _ga_lo[lVar2] = *plVar1 + 1;
    plVar1 = plVar1 + 1;
  }
  for (lVar2 = 1; lVar2 != -1; lVar2 = lVar2 + -1) {
    _ga_hi[lVar2] = *plVar3 + 1;
    plVar3 = plVar3 + 1;
  }
  pnga_print_patch((long)g_a,_ga_lo,_ga_hi,(long)pretty);
  return;
}

Assistant:

void GA_Print_patch(int g_a,int ilo,int ihi,int jlo,int jhi,int pretty)
{
    Integer a = (Integer)g_a;
    Integer lo[2];
    Integer hi[2];
    Integer p = (Integer) pretty;
    Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];

    lo[0] = ilo; lo[1] = jlo;
    hi[0] = ihi; lo[1] = jhi;
    COPYINDEX_C2F(lo,_ga_lo,2);
    COPYINDEX_C2F(hi,_ga_hi,2);
    wnga_print_patch(a, _ga_lo, _ga_hi, p);
}